

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

bool __thiscall Memory::Recycler::StressCollectNow(Recycler *this)

{
  if (this->recyclerStress == true) {
    CollectNow<(Memory::CollectionFlags)16384>(this);
  }
  else if (this->recyclerBackgroundStress == true) {
    CollectNow<(Memory::CollectionFlags)4096>(this);
  }
  else if (((this->enableConcurrentMark == false) && (this->enableConcurrentSweep != true)) ||
          ((this->recyclerConcurrentStress == false &&
           (this->recyclerConcurrentRepeatStress != true)))) {
    if (this->recyclerPartialStress != true) {
      return false;
    }
    CollectNow<(Memory::CollectionFlags)134217728>(this);
  }
  else if (this->recyclerPartialStress == true) {
    CollectNow<(Memory::CollectionFlags)402657280>(this);
  }
  else {
    CollectNow<(Memory::CollectionFlags)268439552>(this);
  }
  return true;
}

Assistant:

bool
Recycler::StressCollectNow()
{
    if (this->recyclerStress)
    {
        this->CollectNow<CollectStress>();
        return true;
    }
#if ENABLE_CONCURRENT_GC
    else if (this->recyclerBackgroundStress)
    {
        this->CollectNow<CollectBackgroundStress>();
        return true;
    }
    else if ((this->enableConcurrentMark || this->enableConcurrentSweep)
        && (this->recyclerConcurrentStress
        || this->recyclerConcurrentRepeatStress))
    {
#if ENABLE_PARTIAL_GC
        if (this->recyclerPartialStress)
        {
            this->CollectNow<CollectConcurrentPartialStress>();
            return true;
        }
        else
#endif // ENABLE_PARTIAL_GC
        {
            this->CollectNow<CollectConcurrentStress>();
            return true;
        }
    }
#endif // ENABLE_CONCURRENT_GC
#if ENABLE_PARTIAL_GC
    else if (this->recyclerPartialStress)
    {
        this->CollectNow<CollectPartialStress>();
        return true;
    }
#endif // ENABLE_PARTIAL_GC
    return false;
}